

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O1

void __thiscall CfgNode::BlockData::BlockData(BlockData *this,Addr addr,int size,bool indirect)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  Instruction *instr;
  int iVar3;
  
  (this->super_Data).m_addr = addr;
  (this->super_Data)._vptr_Data = (_func_int **)&PTR__BlockData_0012a7e8;
  this->m_size = size;
  this->m_indirect = indirect;
  (this->m_instrs).super__List_base<Instruction_*,_std::allocator<Instruction_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->m_instrs;
  (this->m_instrs).super__List_base<Instruction_*,_std::allocator<Instruction_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->m_instrs;
  iVar3 = 0;
  (this->m_instrs).super__List_base<Instruction_*,_std::allocator<Instruction_*>_>._M_impl._M_node.
  _M_size = 0;
  p_Var1 = &(this->m_calls)._M_t._M_impl.super__Rb_tree_header;
  (this->m_calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_calls)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header;
  (this->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  do {
    if (size <= iVar3) {
      return;
    }
    instr = Instruction::get((long)iVar3 + addr,0);
    if (instr->m_size == 0) {
      bVar2 = false;
    }
    else {
      iVar3 = instr->m_size + iVar3;
      if (size < iVar3) {
        bVar2 = false;
      }
      else {
        bVar2 = true;
        addInstruction(this,instr);
      }
    }
  } while (bVar2);
  return;
}

Assistant:

CfgNode::BlockData::BlockData(Addr addr, int size, bool indirect)
	: Data(addr), m_size(size), m_indirect(indirect) {
	int s = 0;
	while (s < size) {
		Instruction* i = Instruction::get(addr + s, 0);
		if (i->size() == 0)
			break;

		s += i->size();
		if (s > size)
			break;

		this->addInstruction(i);
	}
}